

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O1

ex_ex * ex_parse(expr *x,ex_ex *iptr,ex_ex *optr,long *argc)

{
  long lVar1;
  ex_ex *peVar2;
  anon_union_8_5_735de1bb_for_ex_cont *paVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  anon_union_8_5_735de1bb_for_ex_cont aVar7;
  ex_ex *eptr;
  long ac;
  anon_union_8_5_735de1bb_for_ex_cont local_48;
  anon_union_8_5_735de1bb_for_ex_cont aStack_40;
  long local_38;
  
  if (iptr != (ex_ex *)0x0) {
    if (iptr->ex_type == 0) {
      return (ex_ex *)0x0;
    }
    uVar4 = 0x640000;
    lVar1 = 0;
    eptr = iptr;
LAB_00191748:
    switch(eptr->ex_type) {
    case 1:
    case 2:
    case 0xb:
    case 0xc:
    case 0xe:
    case 0x11:
    case 0x14:
    case 0x15:
      goto switchD_0019175d_caseD_1;
    case 3:
      if (((eptr->ex_cont).v_int == 0x20002) &&
         (((argc == (long *)0x0 || (lVar1 == 0)) || (eptr[1].ex_type == 0)))) {
        post("expr: syntax error: illegal comma\n");
        if (eptr[1].ex_type != 0) {
          iptr = eptr;
        }
        goto LAB_001919ba;
      }
      if (eptr[1].ex_type == 0) {
        post("expr: syntax error: missing operand\n");
        goto LAB_001919ba;
      }
      uVar5 = (uint)(eptr->ex_cont).v_flt & 0xffff0000;
      if (uVar5 < uVar4) {
        uVar4 = uVar5;
      }
      break;
    default:
      goto switchD_0019175d_caseD_4;
    case 5:
    case 0xd:
    case 0x10:
    case 0x12:
      if (eptr[1].ex_type != 10) {
        pcVar6 = "expr: syntax error: brackets missing\n";
LAB_00191878:
        post(pcVar6);
        iptr = eptr;
LAB_001919ba:
        ex_print(iptr);
        return (ex_ex *)0x0;
      }
      if ((lVar1 != 0) ||
         (paVar3 = (anon_union_8_5_735de1bb_for_ex_cont *)eptr[1].ex_cont.v_vec,
         paVar3[4].v_int != 0)) goto LAB_00191828;
      aVar7 = *paVar3;
      local_48 = paVar3[1];
      aStack_40 = paVar3[2];
      paVar3[2].v_vec = (t_float *)nullex.ex_end;
      lVar1 = nullex.ex_type;
      *paVar3 = nullex.ex_cont;
      paVar3[1].v_int = lVar1;
      optr->ex_end = eptr->ex_end;
      lVar1 = eptr->ex_type;
      optr->ex_cont = eptr->ex_cont;
      optr->ex_type = lVar1;
      peVar2 = ex_parse(x,eptr + 2,optr + 1,(long *)0x0);
LAB_001918ce:
      paVar3 = (anon_union_8_5_735de1bb_for_ex_cont *)eptr[1].ex_cont.v_vec;
LAB_00191988:
      *paVar3 = aVar7;
      paVar3[1] = local_48;
      paVar3[2] = aStack_40;
      goto LAB_00191993;
    case 6:
      if (eptr[1].ex_type != 9) {
        post("expr: ex_parse: no parenthesis\n");
        return (ex_ex *)0x0;
      }
      if ((lVar1 == 0) &&
         (paVar3 = (anon_union_8_5_735de1bb_for_ex_cont *)eptr[1].ex_cont.v_vec,
         paVar3[4].v_int == 0)) {
        if (paVar3 != &eptr[2].ex_cont) {
          local_38 = 0;
          aVar7 = *paVar3;
          local_48 = paVar3[1];
          aStack_40 = paVar3[2];
          paVar3[2].v_vec = (t_float *)nullex.ex_end;
          lVar1 = nullex.ex_type;
          *paVar3 = nullex.ex_cont;
          paVar3[1].v_int = lVar1;
          optr->ex_end = eptr->ex_end;
          lVar1 = eptr->ex_type;
          optr->ex_cont = eptr->ex_cont;
          optr->ex_type = lVar1;
          peVar2 = ex_parse(x,(ex_ex *)&eptr[2].ex_cont,optr + 1,&local_38);
          if (peVar2 == (ex_ex *)0x0) {
            return (ex_ex *)0x0;
          }
          local_38 = local_38 + 1;
          if (local_38 != *(long *)((eptr->ex_cont).v_vec + 4)) {
            post("expr: syntax error: function \'%s\' needs %ld arguments\n",
                 *(undefined8 *)(eptr->ex_cont).v_vec);
            return (ex_ex *)0x0;
          }
          goto LAB_001918ce;
        }
        pcVar6 = "expr: syntax error: missing argument\n";
        goto LAB_00191878;
      }
LAB_00191828:
      eptr = (ex_ex *)eptr[1].ex_cont.v_int;
      break;
    case 7:
    case 8:
      if (argc == (long *)0x0) {
        pcVar6 = "expr: syntax error: symbols allowed for functions only\n";
        goto LAB_00191878;
      }
      goto switchD_0019175d_caseD_1;
    case 9:
    case 10:
      if ((lVar1 == 0) &&
         (paVar3 = (anon_union_8_5_735de1bb_for_ex_cont *)(eptr->ex_cont).v_vec,
         paVar3[4].v_int == 0)) {
        if (paVar3 == &eptr[1].ex_cont) {
          pcVar6 = "[]";
          if (eptr->ex_type == 9) {
            pcVar6 = "()";
          }
          post("expr: syntax error: empty \'%s\'\n",pcVar6);
          iptr = eptr;
          goto LAB_001919ba;
        }
        aVar7 = *paVar3;
        local_48 = paVar3[1];
        aStack_40 = paVar3[2];
        paVar3[2].v_vec = (t_float *)nullex.ex_end;
        lVar1 = nullex.ex_type;
        *paVar3 = nullex.ex_cont;
        paVar3[1].v_int = lVar1;
        peVar2 = ex_parse(x,(ex_ex *)&eptr[1].ex_cont,optr,(long *)0x0);
        paVar3 = (anon_union_8_5_735de1bb_for_ex_cont *)(eptr->ex_cont).v_vec;
        goto LAB_00191988;
      }
      eptr = (ex_ex *)(eptr->ex_cont).v_int;
    }
    goto LAB_0019182c;
  }
  pcVar6 = "ex_parse: input is null, iptr = 0x%lx\n";
  lVar1 = 0;
  goto LAB_00191844;
switchD_0019175d_caseD_1:
  if ((lVar1 == 0) && (eptr[1].ex_type == 0)) {
    optr->ex_end = eptr->ex_end;
    lVar1 = eptr->ex_type;
    optr->ex_cont = eptr->ex_cont;
    optr->ex_type = lVar1;
    peVar2 = optr + 1;
LAB_00191993:
    optr->ex_end = peVar2;
    return peVar2;
  }
LAB_0019182c:
  eptr = eptr + 1;
  lVar1 = lVar1 + 1;
  goto LAB_00191748;
switchD_0019175d_caseD_4:
  ex_print(eptr);
  lVar1 = eptr->ex_type;
  pcVar6 = "expr: ex_parse: type = 0x%lx\n";
LAB_00191844:
  post(pcVar6,lVar1);
  return (ex_ex *)0x0;
}

Assistant:

struct ex_ex *
ex_parse(struct expr *x, struct ex_ex *iptr, struct ex_ex *optr, long int *argc)
{
        struct ex_ex *eptr;
        struct ex_ex *lowpre = 0;       /* pointer to the lowest precedence */
        struct ex_ex savex = { 0 };
        struct ex_ex *tmpex;
        long pre = HI_PRE;
        long count;

        if (!iptr) {
                post("ex_parse: input is null, iptr = 0x%lx\n", iptr);
                return (exNULL);
        }
        if (!iptr->ex_type)
                return (exNULL);

        /*
         * the following loop finds the lowest precedence operator in the
         * the input token list, comma is explicitly checked here since
         * that is a special operator and is only legal in functions
         */
        for (eptr = iptr, count = 0; eptr->ex_type; eptr++, count++)
                switch (eptr->ex_type) {
                case ET_SYM:
                case ET_VSYM:
                        if (!argc) {
                                post("expr: syntax error: symbols allowed for functions only\n");
                                ex_print(eptr);
                                return (exNULL);
                        }   /* falls through */
                case ET_INT:
                case ET_FLT:
                case ET_II:
                case ET_FI:
                case ET_XI0:
                case ET_YOM1:
                case ET_VI:
                case ET_VAR:
                        if (!count && !eptr[1].ex_type) {
                                *optr = *eptr;
                                                                tmpex = optr;
                                                                tmpex->ex_end = ++optr;
                                return (optr);
                        }
                        break;
                case ET_XI:
                case ET_YO:
                case ET_SI:
                case ET_TBL:
                        if (eptr[1].ex_type != ET_LB) {
                                post("expr: syntax error: brackets missing\n");
                                ex_print(eptr);
                                return (exNULL);
                        }
                        /* if this table is the only token, parse the table */
                        if (!count &&
                            !((struct ex_ex *) eptr[1].ex_ptr)[1].ex_type) {
                                savex = *((struct ex_ex *) eptr[1].ex_ptr);
                                *((struct ex_ex *) eptr[1].ex_ptr) = nullex;
                                *optr = *eptr;
                                lowpre = ex_parse(x, &eptr[2], optr + 1, (long *)0);
                                *((struct ex_ex *) eptr[1].ex_ptr) = savex;
                                                                optr->ex_end = lowpre;
                                return(lowpre);
                        }
                        eptr = (struct ex_ex *) eptr[1].ex_ptr;
                        break;
                case ET_OP:
                        if (eptr->ex_op == OP_COMMA) {
                                if (!argc || !count || !eptr[1].ex_type) {
                                        post("expr: syntax error: illegal comma\n");
                                        ex_print(eptr[1].ex_type ? eptr : iptr);
                                        return (exNULL);
                                }
                        }
                        if (!eptr[1].ex_type) {
                                post("expr: syntax error: missing operand\n");
                                ex_print(iptr);
                                return (exNULL);
                        }
                        if ((eptr->ex_op & PRE_MASK) <= pre) {
                                pre = eptr->ex_op & PRE_MASK;
                                lowpre = eptr;
                        }
                        break;
                case ET_FUNC:
                        if (eptr[1].ex_type != ET_LP) {
                                post("expr: ex_parse: no parenthesis\n");
                                return (exNULL);
                        }
                        /* if this function is the only token, parse it */
                        if (!count &&
                            !((struct ex_ex *) eptr[1].ex_ptr)[1].ex_type) {
                                long ac;

                                if (eptr[1].ex_ptr == (char *) &eptr[2]) {
                                        post("expr: syntax error: missing argument\n");
                                        ex_print(eptr);
                                        return (exNULL);
                                }
                                ac = 0;
                                savex = *((struct ex_ex *) eptr[1].ex_ptr);
                                *((struct ex_ex *) eptr[1].ex_ptr) = nullex;
                                *optr = *eptr;
                                lowpre = ex_parse(x, &eptr[2], optr + 1, &ac);
                                if (!lowpre)
                                        return (exNULL);
                                ac++;
                                if (ac !=
                                    ((t_ex_func *)eptr->ex_ptr)->f_argc){
                                        post("expr: syntax error: function '%s' needs %ld arguments\n",
                                            ((t_ex_func *)eptr->ex_ptr)->f_name,
                                            ((t_ex_func *)eptr->ex_ptr)->f_argc);
                                        return (exNULL);
                                }
                                *((struct ex_ex *) eptr[1].ex_ptr) = savex;
                                                                optr->ex_end = lowpre;
                                return (lowpre);
                        }
                        eptr = (struct ex_ex *) eptr[1].ex_ptr;
                        break;
                case ET_LP:
                case ET_LB:
                        if (!count &&
                            !((struct ex_ex *) eptr->ex_ptr)[1].ex_type) {
                                if (eptr->ex_ptr == (char *)(&eptr[1])) {
                                        post("expr: syntax error: empty '%s'\n",
                                            eptr->ex_type==ET_LP?"()":"[]");
                                        ex_print(eptr);
                                        return (exNULL);
                                }
                                savex = *((struct ex_ex *) eptr->ex_ptr);
                                *((struct ex_ex *) eptr->ex_ptr) = nullex;
                                lowpre = ex_parse(x, &eptr[1], optr, (long *)0);
                                *((struct ex_ex *) eptr->ex_ptr) = savex;
                                                                optr->ex_end = lowpre;
                                return (lowpre);
                        }
                        eptr = (struct ex_ex *)eptr->ex_ptr;
                        break;
                case ET_STR:
                default:
                        ex_print(eptr);
                        post("expr: ex_parse: type = 0x%lx\n", eptr->ex_type);
                        return (exNULL);
                }

        if (pre == HI_PRE) {
                post("expr: syntax error: missing operation\n");
                ex_print(iptr);
                return (exNULL);
        }
        if (count < 2) {
                post("expr: syntax error: mission operand\n");
                ex_print(iptr);
                return (exNULL);
        }
        if (count == 2) {
                if (lowpre != iptr) {
                        post("expr: ex_parse: unary operator should be first\n");
                        return (exNULL);
                }
                if (!unary_op(lowpre->ex_op)) {
                        post("expr: syntax error: not a uniary operator\n");
                        ex_print(iptr);
                        return (exNULL);
                }
                *optr = *lowpre;
                eptr = ex_parse(x, &lowpre[1], optr + 1, argc);
                                optr->ex_end = eptr;
                return (eptr);
        }
        /* this is the case of using unary operator as a binary opetator */
        if (count == 3 && unary_op(lowpre->ex_op)) {
                post("expr: syntax error, missing operand before unary operator\n");
                ex_print(iptr);
                return (exNULL);
        }
        if (lowpre == iptr) {
                post("expr: syntax error: mission operand\n");
                ex_print(iptr);
                return (exNULL);
        }
        savex = *lowpre;
        *lowpre = nullex;
        if (savex.ex_op != OP_COMMA) {
            *optr = savex;
                eptr = ex_parse(x, iptr, optr + 1, argc);
                } else {
            (*argc)++;
                eptr = ex_parse(x, iptr, optr, argc);
                }
        if (eptr) {
                eptr = ex_parse(x, &lowpre[1], eptr, argc);
                *lowpre = savex;
        }
                optr->ex_end = eptr;
        return (eptr);
}